

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

Id __thiscall
anon_unknown.dwarf_deef1e::TGlslangToSpvTraverser::getSampledType
          (TGlslangToSpvTraverser *this,TSampler *sampler)

{
  Id IVar1;
  bool bVar2;
  Capability local_1c [3];
  
  switch(*(undefined1 *)sampler) {
  case 1:
    IVar1 = spv::Builder::makeFloatType(&this->builder,0x20);
    return IVar1;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                  ,0x1315,
                  "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::getSampledType(const glslang::TSampler &)"
                 );
  case 3:
    spv::Builder::addExtension(&this->builder,"SPV_AMD_gpu_shader_half_float_fetch");
    local_1c[0] = CapabilityFloat16ImageAMD;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,local_1c);
    IVar1 = spv::Builder::makeFloatType(&this->builder,0x10);
    return IVar1;
  case 8:
    bVar2 = true;
    break;
  case 9:
    bVar2 = false;
    break;
  case 10:
    spv::Builder::addExtension(&this->builder,"SPV_EXT_shader_image_int64");
    local_1c[1] = 0x1398;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,local_1c + 1);
    bVar2 = true;
    goto LAB_003bcef7;
  case 0xb:
    spv::Builder::addExtension(&this->builder,"SPV_EXT_shader_image_int64");
    local_1c[2] = 0x1398;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,local_1c + 2);
    bVar2 = false;
LAB_003bcef7:
    IVar1 = spv::Builder::makeIntegerType(&this->builder,0x40,bVar2);
    return IVar1;
  }
  IVar1 = spv::Builder::makeIntegerType(&this->builder,0x20,bVar2);
  return IVar1;
}

Assistant:

spv::Id TGlslangToSpvTraverser::getSampledType(const glslang::TSampler& sampler)
{
    switch (sampler.type) {
        case glslang::EbtInt:      return builder.makeIntType(32);
        case glslang::EbtUint:     return builder.makeUintType(32);
        case glslang::EbtFloat:    return builder.makeFloatType(32);
        case glslang::EbtFloat16:
            builder.addExtension(spv::E_SPV_AMD_gpu_shader_half_float_fetch);
            builder.addCapability(spv::CapabilityFloat16ImageAMD);
            return builder.makeFloatType(16);
        case glslang::EbtInt64:
            builder.addExtension(spv::E_SPV_EXT_shader_image_int64);
            builder.addCapability(spv::CapabilityInt64ImageEXT);
            return builder.makeIntType(64);
        case glslang::EbtUint64:
            builder.addExtension(spv::E_SPV_EXT_shader_image_int64);
            builder.addCapability(spv::CapabilityInt64ImageEXT);
            return builder.makeUintType(64);
        default:
            assert(0);
            return builder.makeFloatType(32);
    }
}